

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

void benchmark::ReplaceAll(string *str,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t start;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find(in_RDI,in_RSI);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)in_RDI,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  return;
}

Assistant:

void ReplaceAll(std::string* str, const std::string& from,
                const std::string& to) {
  std::size_t start = 0;
  while((start = str->find(from, start)) != std::string::npos) {
    str->replace(start, from.length(), to);
    start += to.length();
  }
}